

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllKeys
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          TNamesDepend *a_names)

{
  const_iterator a_pLeft;
  const_iterator this_00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Self local_78;
  int local_6c;
  const_iterator cStack_68;
  int n;
  const_iterator iKeyVal;
  char *pLastKey;
  TKeyVal *section;
  Entry local_48;
  _Self local_30;
  const_iterator iSection;
  TNamesDepend *a_names_local;
  char *a_pSection_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  iSection._M_node = (_Base_ptr)a_names;
  std::__cxx11::
  list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ::clear(a_names);
  if (a_pSection == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    Entry::Entry(&local_48,a_pSection,0);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
         ::find(&this->m_data,&local_48);
    section = (TKeyVal *)
              std::
              map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
              ::end(&this->m_data);
    bVar1 = std::operator==(&local_30,(_Self *)&section);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>
               ::operator->(&local_30);
      iKeyVal._M_node = (_Base_ptr)0x0;
      cStack_68 = std::
                  multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                  ::begin(&ppVar2->second);
      local_6c = 0;
      while( true ) {
        local_78._M_node =
             (_Base_ptr)
             std::
             multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
             ::end(&ppVar2->second);
        bVar1 = std::operator!=(&stack0xffffffffffffff98,&local_78);
        a_pLeft = iKeyVal;
        if (!bVar1) break;
        if (iKeyVal._M_node == (_Base_ptr)0x0) {
LAB_0019e695:
          this_00._M_node = iSection._M_node;
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                   ::operator->(&stack0xffffffffffffff98);
          std::__cxx11::
          list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
          ::push_back((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                       *)this_00._M_node,&ppVar3->first);
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                   ::operator->(&stack0xffffffffffffff98);
          iKeyVal._M_node = (_Base_ptr)(ppVar3->first).pItem;
        }
        else {
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                   ::operator->(&stack0xffffffffffffff98);
          bVar1 = IsLess(this,(char *)a_pLeft._M_node,(ppVar3->first).pItem);
          if (bVar1) goto LAB_0019e695;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
        ::operator++(&stack0xffffffffffffff98);
        local_6c = local_6c + 1;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::GetAllKeys(const SI_CHAR *a_pSection,
																	TNamesDepend &a_names) const {
	a_names.clear();

	if (!a_pSection) {
		return false;
	}

	typename TSection::const_iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return false;
	}

	const TKeyVal &section = iSection->second;
	const SI_CHAR *pLastKey = NULL;
	typename TKeyVal::const_iterator iKeyVal = section.begin();
	for (int n = 0; iKeyVal != section.end(); ++iKeyVal, ++n) {
		if (!pLastKey || IsLess(pLastKey, iKeyVal->first.pItem)) {
			a_names.push_back(iKeyVal->first);
			pLastKey = iKeyVal->first.pItem;
		}
	}

	return true;
}